

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerTargeter::EndEffect(APowerTargeter *this)

{
  bool bVar1;
  AActor *pAVar2;
  DPSprite *pDVar3;
  DPSprite *pspr;
  APowerTargeter *this_local;
  
  APowerup::EndEffect(&this->super_APowerup);
  bVar1 = TObjPtr<AActor>::operator!=(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if ((bVar1) &&
     (pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner),
     pAVar2->player != (player_t *)0x0)) {
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    pDVar3 = player_t::FindPSprite(pAVar2->player,0x7ffffffd);
    if (pDVar3 != (DPSprite *)0x0) {
      DPSprite::SetState(pDVar3,(FState *)0x0,false);
    }
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    pDVar3 = player_t::FindPSprite(pAVar2->player,0x7ffffffe);
    if (pDVar3 != (DPSprite *)0x0) {
      DPSprite::SetState(pDVar3,(FState *)0x0,false);
    }
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    pDVar3 = player_t::FindPSprite(pAVar2->player,0x7fffffff);
    if (pDVar3 != (DPSprite *)0x0) {
      DPSprite::SetState(pDVar3,(FState *)0x0,false);
    }
  }
  return;
}

Assistant:

void APowerTargeter::EndEffect ()
{
	Super::EndEffect();
	if (Owner != nullptr && Owner->player != nullptr)
	{
		// Calling GetPSprite here could crash if we're creating a new game.
		// This is because P_SetupLevel nulls the player's mo before destroying
		// every DThinker which in turn ends up calling this.
		// However P_SetupLevel is only called after G_NewInit which calls
		// every player's dtor which destroys all their psprites.
		DPSprite *pspr;
		if ((pspr = Owner->player->FindPSprite(PSP_TARGETCENTER)) != nullptr) pspr->SetState(nullptr);
		if ((pspr = Owner->player->FindPSprite(PSP_TARGETLEFT)) != nullptr) pspr->SetState(nullptr);
		if ((pspr = Owner->player->FindPSprite(PSP_TARGETRIGHT)) != nullptr) pspr->SetState(nullptr);
	}
}